

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_Constractor6_Test::TestBody(ConfidentialTxOut_Constractor6_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  AssertHelper local_5f0;
  Message local_5e8;
  int local_5dc;
  undefined8 local_5d8;
  undefined1 local_5d0;
  undefined8 local_5c8;
  undefined1 local_5c0;
  long local_5b8;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_6;
  Message local_598;
  ByteData local_590;
  string local_578 [32];
  undefined1 local_558 [8];
  AssertionResult gtest_ar_5;
  Message local_540;
  ByteData local_538;
  string local_520 [32];
  undefined1 local_500 [8];
  AssertionResult gtest_ar_4;
  Message local_4e8;
  ConfidentialNonce local_4e0;
  string local_4b8 [32];
  undefined1 local_498 [8];
  AssertionResult gtest_ar_3;
  Message local_480;
  Script local_478;
  string local_440 [32];
  undefined1 local_420 [8];
  AssertionResult gtest_ar_2;
  Message local_408;
  long local_400;
  undefined8 local_3f8;
  undefined1 local_3f0;
  ConfidentialValue local_3e8;
  undefined8 local_3c0;
  undefined1 local_3b8;
  long local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_1;
  Message local_390;
  string local_388 [32];
  ConfidentialAssetId local_368;
  string local_340 [32];
  undefined1 local_320 [8];
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  undefined8 local_208;
  Amount amount;
  allocator local_1e1;
  string local_1e0 [32];
  ElementsConfidentialAddress local_1c0 [8];
  ElementsConfidentialAddress address;
  ConfidentialTxOut_Constractor6_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,&local_1e1);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1c0,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  local_208 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  amount = extraout_DL;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&gtest_ar.message_,local_1c0,&exp_asset,(Amount *)&local_208);
  cfd::core::ConfidentialTxOut::GetAsset(&local_368,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_320,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             pcVar2,rhs);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_340);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  cfd::core::ConfidentialTxOut::GetConfidentialValue
            (&local_3e8,(ConfidentialTxOut *)&gtest_ar.message_);
  local_3f8 = cfd::core::ConfidentialValue::GetAmount();
  local_3f0 = extraout_DL_00;
  local_3c0 = local_3f8;
  local_3b8 = extraout_DL_00;
  local_3b0 = cfd::core::Amount::GetSatoshiValue();
  local_400 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_3a8,
             "txout.GetConfidentialValue().GetAmount().GetSatoshiValue()","amount.GetSatoshiValue()"
             ,&local_3b0,&local_400);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  cfd::core::AbstractTxOut::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_420,"txout.GetLockingScript().GetHex().c_str()",
             "\"0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",pcVar2,
             "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  std::__cxx11::string::~string(local_440);
  cfd::core::Script::~Script(&local_478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  cfd::core::ConfidentialTxOut::GetNonce(&local_4e0,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_498,"txout.GetNonce().GetHex().c_str()",
             "\"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800\"",pcVar2,
             "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");
  std::__cxx11::string::~string(local_4b8);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  cfd::core::ConfidentialTxOut::GetRangeProof(&local_538,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_500,"txout.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string(local_520);
  cfd::core::ByteData::~ByteData(&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  cfd::core::ConfidentialTxOut::GetSurjectionProof
            (&local_590,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_558,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string(local_578);
  cfd::core::ByteData::~ByteData(&local_590);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  local_5d8 = cfd::core::AbstractTxOut::GetValue();
  local_5d0 = extraout_DL_01;
  local_5c8 = local_5d8;
  local_5c0 = extraout_DL_01;
  local_5b8 = cfd::core::Amount::GetSatoshiValue();
  local_5dc = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_5b0,"txout.GetValue().GetSatoshiValue()","0",&local_5b8,
             &local_5dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_5f0);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_1c0);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor6) {
  // ConfidentialAssetId, ConfidentialValue
  ElementsConfidentialAddress address("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz");
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(address, exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
      "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(),
      "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}